

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

string_t duckdb::BinaryLambdaWrapper::
         Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                   (anon_class_8_1_6971b95b fun,string_t left,long right,ValidityMask *mask,
                   idx_t idx)

{
  bool bVar1;
  ulong uVar2;
  OutOfRangeException *this;
  idx_t len;
  ulong left_00;
  uint uVar3;
  uint64_t right_00;
  undefined1 *__dest;
  void *__src;
  string_t sVar4;
  string_t result_str;
  idx_t copy_size;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  Vector *local_48;
  undefined8 local_40;
  void *local_38;
  
  local_68._8_8_ = local_68._0_8_;
  local_38 = left.value._8_8_;
  local_40 = left.value._0_8_;
  uVar3 = left.value._0_4_;
  __src = local_38;
  if (uVar3 < 0xd) {
    __src = (void *)((long)&local_40 + 4);
  }
  left_00 = (ulong)uVar3;
  right_00 = 0;
  if (uVar3 != 0 && 0 < right) {
    right_00 = right;
  }
  bVar1 = TryMultiplyOperator::Operation<unsigned_long,unsigned_long,unsigned_long>
                    (left_00,right_00,(uint64_t *)&local_48);
  if (bVar1) {
    local_68 = (undefined1  [16])StringVector::EmptyString((StringVector *)fun.result,local_48,len);
    uVar2 = local_68._0_8_;
    __dest = local_68._8_8_;
    if (local_68._0_4_ < 0xd) {
      __dest = local_68 + 4;
    }
    if (uVar3 != 0 && 0 < right) {
      do {
        switchD_00b03519::default(__dest,__src,left_00);
        __dest = __dest + left_00;
        right = right + -1;
      } while (right != 0);
      uVar2 = (ulong)(uint)local_68._0_4_;
    }
    if ((uint)uVar2 < 0xd) {
      switchD_005681f0::default(local_68 + 4 + (uVar2 & 0xffffffff),0,0xc - (uVar2 & 0xffffffff));
    }
    else {
      local_68._4_4_ = *(undefined4 *)local_68._8_8_;
    }
    sVar4.value.pointer.ptr = (char *)local_68._8_8_;
    sVar4.value._0_8_ = local_68._0_8_;
    return (string_t)sVar4.value;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_68._0_8_ = local_58;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "Cannot create a string of size: \'%d\' * \'%d\', the maximum supported string size is: \'%d\'"
             ,"");
  OutOfRangeException::OutOfRangeException<unsigned_long,unsigned_long,unsigned_long>
            (this,(string *)local_68,left_00,right_00,0xffffffff);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}